

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O1

Transaction * __thiscall
cfd::core::Block::GetTransaction(Transaction *__return_storage_ptr__,Block *this,Txid *txid)

{
  Txid *txid_00;
  pointer pTVar1;
  bool bVar2;
  CfdException *this_00;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  string local_50;
  
  txid_00 = (this->txids_).super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>.
            _M_impl.super__Vector_impl_data._M_start;
  bVar5 = (this->txids_).super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>.
          _M_impl.super__Vector_impl_data._M_finish != txid_00;
  if (bVar5) {
    bVar2 = Txid::Equals(txid,txid_00);
    if (bVar2) {
      uVar3 = 0;
    }
    else {
      lVar4 = 0x20;
      uVar3 = 0;
      do {
        uVar3 = uVar3 + 1;
        pTVar1 = (this->txids_).
                 super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
                 super__Vector_impl_data._M_start;
        bVar5 = uVar3 < (ulong)((long)(this->txids_).
                                      super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 5
                               );
        if (!bVar5) goto LAB_0041a2b4;
        bVar2 = Txid::Equals(txid,(Txid *)((long)&pTVar1->_vptr_Txid + lVar4));
        lVar4 = lVar4 + 0x20;
      } while (!bVar2);
    }
    Transaction::Transaction
              (__return_storage_ptr__,
               (this->txs_).
               super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
               .super__Vector_impl_data._M_start + uVar3);
    if (bVar5) {
      return __return_storage_ptr__;
    }
  }
LAB_0041a2b4:
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"target txid not found.","")
  ;
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_50);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Transaction Block::GetTransaction(const Txid& txid) const {
  for (size_t index = 0; index < txids_.size(); ++index) {
    if (txid.Equals(txids_[index])) {
      return Transaction(txs_[index]);
    }
  }
  throw CfdException(
      CfdError::kCfdIllegalArgumentError, "target txid not found.");
}